

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O3

void Abc_NtkReassignIds(Abc_Ntk_t *pNtk)

{
  uint uVar1;
  void *pvVar2;
  long *plVar3;
  Abc_Obj_t *pAVar4;
  Vec_Ptr_t *pVVar5;
  void **ppvVar6;
  Abc_Obj_t *pAVar7;
  Vec_Ptr_t *pVVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcUtil.c"
                  ,0x716,"void Abc_NtkReassignIds(Abc_Ntk_t *)");
  }
  uVar1 = pNtk->nObjs;
  pVVar5 = (Vec_Ptr_t *)malloc(0x10);
  uVar16 = 8;
  if (6 < uVar1 - 1) {
    uVar16 = (ulong)uVar1;
  }
  pVVar5->nSize = 0;
  iVar9 = (int)uVar16;
  pVVar5->nCap = iVar9;
  if (iVar9 == 0) {
    ppvVar6 = (void **)0x0;
  }
  else {
    ppvVar6 = (void **)malloc((long)iVar9 << 3);
  }
  pVVar5->pArray = ppvVar6;
  pAVar7 = Abc_AigConst1(pNtk);
  if (pAVar7->Id != 0) {
    __assert_fail("pConst1->Id == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcUtil.c"
                  ,0x71c,"void Abc_NtkReassignIds(Abc_Ntk_t *)");
  }
  if (iVar9 == 0) {
    if (ppvVar6 == (void **)0x0) {
      ppvVar6 = (void **)malloc(0x80);
    }
    else {
      ppvVar6 = (void **)realloc(ppvVar6,0x80);
    }
    pVVar5->pArray = ppvVar6;
    pVVar5->nCap = 0x10;
    uVar16 = 0x10;
  }
  pVVar5->nSize = 1;
  *ppvVar6 = pAVar7;
  pVVar8 = pNtk->vPis;
  if (pVVar8->nSize < 1) {
    iVar9 = 1;
  }
  else {
    lVar10 = 0;
    do {
      iVar9 = (int)lVar10 + 1;
      pvVar2 = pVVar8->pArray[lVar10];
      *(int *)((long)pvVar2 + 0x10) = iVar9;
      iVar12 = (int)uVar16;
      if (iVar9 == iVar12) {
        if (iVar12 < 0x10) {
          if (pVVar5->pArray == (void **)0x0) {
            ppvVar6 = (void **)malloc(0x80);
          }
          else {
            ppvVar6 = (void **)realloc(pVVar5->pArray,0x80);
          }
          pVVar5->pArray = ppvVar6;
          pVVar5->nCap = 0x10;
          uVar16 = 0x10;
        }
        else {
          uVar16 = (ulong)(uint)(iVar12 * 2);
          if (pVVar5->pArray == (void **)0x0) {
            ppvVar6 = (void **)malloc(uVar16 * 8);
          }
          else {
            ppvVar6 = (void **)realloc(pVVar5->pArray,uVar16 * 8);
          }
          pVVar5->pArray = ppvVar6;
          pVVar5->nCap = iVar12 * 2;
        }
      }
      else {
        ppvVar6 = pVVar5->pArray;
      }
      pVVar5->nSize = (int)lVar10 + 2;
      ppvVar6[lVar10 + 1] = pvVar2;
      lVar10 = lVar10 + 1;
      pVVar8 = pNtk->vPis;
    } while (lVar10 < pVVar8->nSize);
    iVar9 = (int)lVar10 + 1;
  }
  pVVar8 = pNtk->vPos;
  if (0 < pVVar8->nSize) {
    lVar10 = (long)iVar9;
    lVar14 = 0;
    do {
      pvVar2 = pVVar8->pArray[lVar14];
      *(int *)((long)pvVar2 + 0x10) = iVar9;
      iVar12 = (int)uVar16;
      if (iVar9 == iVar12) {
        if (iVar12 < 0x10) {
          if (pVVar5->pArray == (void **)0x0) {
            ppvVar6 = (void **)malloc(0x80);
          }
          else {
            ppvVar6 = (void **)realloc(pVVar5->pArray,0x80);
          }
          pVVar5->pArray = ppvVar6;
          pVVar5->nCap = 0x10;
          uVar16 = 0x10;
        }
        else {
          uVar16 = (ulong)(uint)(iVar12 * 2);
          if (pVVar5->pArray == (void **)0x0) {
            ppvVar6 = (void **)malloc(uVar16 * 8);
          }
          else {
            ppvVar6 = (void **)realloc(pVVar5->pArray,uVar16 * 8);
          }
          pVVar5->pArray = ppvVar6;
          pVVar5->nCap = iVar12 * 2;
        }
      }
      else {
        ppvVar6 = pVVar5->pArray;
      }
      iVar9 = iVar9 + 1;
      pVVar5->nSize = iVar9;
      ppvVar6[lVar10 + lVar14] = pvVar2;
      lVar14 = lVar14 + 1;
      pVVar8 = pNtk->vPos;
    } while (lVar14 < pVVar8->nSize);
  }
  pVVar8 = pNtk->vBoxes;
  uVar17 = uVar16;
  if (0 < pVVar8->nSize) {
    lVar10 = 0;
    uVar13 = uVar16;
    iVar12 = iVar9;
    do {
      plVar3 = (long *)pVVar8->pArray[lVar10];
      *(int *)(plVar3 + 2) = iVar12;
      iVar9 = (int)uVar16;
      if (iVar12 == iVar9) {
        if (iVar9 < 0x10) {
          if (pVVar5->pArray == (void **)0x0) {
            ppvVar6 = (void **)malloc(0x80);
          }
          else {
            ppvVar6 = (void **)realloc(pVVar5->pArray,0x80);
          }
          pVVar5->pArray = ppvVar6;
          pVVar5->nCap = 0x10;
          uVar17 = 0x10;
          uVar13 = 0x10;
          uVar16 = 0x10;
        }
        else {
          uVar1 = iVar9 * 2;
          uVar16 = (ulong)uVar1;
          if (pVVar5->pArray == (void **)0x0) {
            ppvVar6 = (void **)malloc(uVar16 * 8);
          }
          else {
            ppvVar6 = (void **)realloc(pVVar5->pArray,uVar16 * 8);
          }
          pVVar5->pArray = ppvVar6;
          pVVar5->nCap = uVar1;
          uVar17 = (ulong)uVar1;
          uVar13 = (ulong)uVar1;
        }
      }
      else {
        ppvVar6 = pVVar5->pArray;
      }
      iVar9 = iVar12 + 1;
      pVVar5->nSize = iVar9;
      ppvVar6[iVar12] = plVar3;
      if (0 < *(int *)((long)plVar3 + 0x1c)) {
        lVar14 = (long)iVar9;
        lVar15 = 0;
        uVar16 = uVar13;
        do {
          pvVar2 = *(void **)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                             (long)*(int *)(plVar3[4] + lVar15 * 4) * 8);
          *(int *)((long)pvVar2 + 0x10) = iVar9;
          iVar12 = (int)uVar16;
          if (iVar9 == iVar12) {
            if (iVar12 < 0x10) {
              if (pVVar5->pArray == (void **)0x0) {
                ppvVar6 = (void **)malloc(0x80);
              }
              else {
                ppvVar6 = (void **)realloc(pVVar5->pArray,0x80);
              }
              pVVar5->pArray = ppvVar6;
              pVVar5->nCap = 0x10;
              uVar17 = 0x10;
              uVar16 = 0x10;
            }
            else {
              uVar1 = iVar12 * 2;
              uVar16 = (ulong)uVar1;
              if (pVVar5->pArray == (void **)0x0) {
                ppvVar6 = (void **)malloc(uVar16 * 8);
              }
              else {
                ppvVar6 = (void **)realloc(pVVar5->pArray,uVar16 * 8);
              }
              pVVar5->pArray = ppvVar6;
              pVVar5->nCap = uVar1;
              uVar17 = (ulong)uVar1;
            }
          }
          else {
            ppvVar6 = pVVar5->pArray;
          }
          iVar9 = iVar9 + 1;
          pVVar5->nSize = iVar9;
          ppvVar6[lVar14 + lVar15] = pvVar2;
          lVar15 = lVar15 + 1;
          uVar13 = uVar16;
        } while (lVar15 < *(int *)((long)plVar3 + 0x1c));
      }
      if (0 < *(int *)((long)plVar3 + 0x2c)) {
        lVar14 = (long)iVar9;
        lVar15 = 0;
        uVar16 = uVar17;
        do {
          pvVar2 = *(void **)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                             (long)*(int *)(plVar3[6] + lVar15 * 4) * 8);
          *(int *)((long)pvVar2 + 0x10) = iVar9;
          iVar12 = (int)uVar16;
          if (iVar9 == iVar12) {
            if (iVar12 < 0x10) {
              if (pVVar5->pArray == (void **)0x0) {
                ppvVar6 = (void **)malloc(0x80);
              }
              else {
                ppvVar6 = (void **)realloc(pVVar5->pArray,0x80);
              }
              pVVar5->pArray = ppvVar6;
              pVVar5->nCap = 0x10;
              uVar16 = 0x10;
            }
            else {
              uVar16 = (ulong)(uint)(iVar12 * 2);
              if (pVVar5->pArray == (void **)0x0) {
                ppvVar6 = (void **)malloc(uVar16 * 8);
              }
              else {
                ppvVar6 = (void **)realloc(pVVar5->pArray,uVar16 * 8);
              }
              pVVar5->pArray = ppvVar6;
              pVVar5->nCap = iVar12 * 2;
            }
          }
          else {
            ppvVar6 = pVVar5->pArray;
          }
          iVar9 = iVar9 + 1;
          pVVar5->nSize = iVar9;
          ppvVar6[lVar14 + lVar15] = pvVar2;
          lVar15 = lVar15 + 1;
          uVar13 = uVar16;
          uVar17 = uVar16;
        } while (lVar15 < *(int *)((long)plVar3 + 0x2c));
      }
      lVar10 = lVar10 + 1;
      pVVar8 = pNtk->vBoxes;
      iVar12 = iVar9;
    } while (lVar10 < pVVar8->nSize);
  }
  pVVar8 = Abc_AigDfs(pNtk,1,0);
  iVar12 = pVVar8->nSize;
  if (0 < iVar12) {
    lVar10 = 0;
    do {
      pAVar4 = (Abc_Obj_t *)pVVar8->pArray[lVar10];
      if (pAVar4 != pAVar7) {
        pAVar4->Id = iVar9;
        iVar12 = (int)uVar17;
        if (iVar9 == iVar12) {
          if (iVar12 < 0x10) {
            if (pVVar5->pArray == (void **)0x0) {
              ppvVar6 = (void **)malloc(0x80);
            }
            else {
              ppvVar6 = (void **)realloc(pVVar5->pArray,0x80);
            }
            pVVar5->pArray = ppvVar6;
            pVVar5->nCap = 0x10;
            uVar17 = 0x10;
          }
          else {
            uVar17 = (ulong)(uint)(iVar12 * 2);
            if (pVVar5->pArray == (void **)0x0) {
              ppvVar6 = (void **)malloc(uVar17 * 8);
            }
            else {
              ppvVar6 = (void **)realloc(pVVar5->pArray,uVar17 * 8);
            }
            pVVar5->pArray = ppvVar6;
            pVVar5->nCap = iVar12 * 2;
          }
        }
        else {
          ppvVar6 = pVVar5->pArray;
        }
        lVar14 = (long)iVar9;
        iVar9 = iVar9 + 1;
        pVVar5->nSize = iVar9;
        ppvVar6[lVar14] = pAVar4;
        iVar12 = pVVar8->nSize;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < iVar12);
  }
  if (pVVar8->pArray != (void **)0x0) {
    free(pVVar8->pArray);
  }
  free(pVVar8);
  if (iVar9 != pNtk->nObjs) {
    __assert_fail("Vec_PtrSize(vObjsNew) == pNtk->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcUtil.c"
                  ,0x744,"void Abc_NtkReassignIds(Abc_Ntk_t *)");
  }
  pVVar8 = pNtk->vObjs;
  ppvVar6 = pVVar8->pArray;
  if (0 < pVVar8->nSize) {
    lVar10 = 0;
    do {
      plVar3 = (long *)ppvVar6[lVar10];
      if (plVar3 != (long *)0x0) {
        if (0 < *(int *)((long)plVar3 + 0x1c)) {
          lVar14 = plVar3[4];
          lVar15 = *(long *)(*(long *)(*plVar3 + 0x20) + 8);
          lVar11 = 0;
          do {
            *(undefined4 *)(lVar14 + lVar11 * 4) =
                 *(undefined4 *)(*(long *)(lVar15 + (long)*(int *)(lVar14 + lVar11 * 4) * 8) + 0x10)
            ;
            lVar11 = lVar11 + 1;
          } while (lVar11 < *(int *)((long)plVar3 + 0x1c));
        }
        if (0 < *(int *)((long)plVar3 + 0x2c)) {
          lVar14 = plVar3[6];
          lVar15 = *(long *)(*(long *)(*plVar3 + 0x20) + 8);
          lVar11 = 0;
          do {
            *(undefined4 *)(lVar14 + lVar11 * 4) =
                 *(undefined4 *)(*(long *)(lVar15 + (long)*(int *)(lVar14 + lVar11 * 4) * 8) + 0x10)
            ;
            lVar11 = lVar11 + 1;
          } while (lVar11 < *(int *)((long)plVar3 + 0x2c));
        }
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < pVVar8->nSize);
  }
  if (ppvVar6 != (void **)0x0) {
    free(ppvVar6);
  }
  free(pVVar8);
  pNtk->vObjs = pVVar5;
  Abc_AigRehash((Abc_Aig_t *)pNtk->pManFunc);
  return;
}

Assistant:

void Abc_NtkReassignIds( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vNodes;
    Vec_Ptr_t * vObjsNew;
    Abc_Obj_t * pNode, * pTemp, * pConst1;
    int i, k;
    assert( Abc_NtkIsStrash(pNtk) );
//printf( "Total = %d. Current = %d.\n", Abc_NtkObjNumMax(pNtk), Abc_NtkObjNum(pNtk) );
    // start the array of objects with new IDs
    vObjsNew = Vec_PtrAlloc( pNtk->nObjs );
    // put constant node first
    pConst1 = Abc_AigConst1(pNtk);
    assert( pConst1->Id == 0 );
    Vec_PtrPush( vObjsNew, pConst1 );
    // put PI nodes next
    Abc_NtkForEachPi( pNtk, pNode, i )
    {
        pNode->Id = Vec_PtrSize( vObjsNew );
        Vec_PtrPush( vObjsNew, pNode );
    }
    // put PO nodes next
    Abc_NtkForEachPo( pNtk, pNode, i )
    {
        pNode->Id = Vec_PtrSize( vObjsNew );
        Vec_PtrPush( vObjsNew, pNode );
    }
    // put latches and their inputs/outputs next
    Abc_NtkForEachBox( pNtk, pNode, i )
    {
        pNode->Id = Vec_PtrSize( vObjsNew );
        Vec_PtrPush( vObjsNew, pNode );
        Abc_ObjForEachFanin( pNode, pTemp, k )
        {
            pTemp->Id = Vec_PtrSize( vObjsNew );
            Vec_PtrPush( vObjsNew, pTemp );
        }
        Abc_ObjForEachFanout( pNode, pTemp, k )
        {
            pTemp->Id = Vec_PtrSize( vObjsNew );
            Vec_PtrPush( vObjsNew, pTemp );
        }
    }
    // finally, internal nodes in the DFS order
    vNodes = Abc_AigDfs( pNtk, 1, 0 );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
    {
        if ( pNode == pConst1 )
            continue;
        pNode->Id = Vec_PtrSize( vObjsNew );
        Vec_PtrPush( vObjsNew, pNode );
    }
    Vec_PtrFree( vNodes );
    assert( Vec_PtrSize(vObjsNew) == pNtk->nObjs );

    // update the fanin/fanout arrays
    Abc_NtkForEachObj( pNtk, pNode, i )
    {
        Abc_ObjForEachFanin( pNode, pTemp, k )
            pNode->vFanins.pArray[k] = pTemp->Id;
        Abc_ObjForEachFanout( pNode, pTemp, k )
            pNode->vFanouts.pArray[k] = pTemp->Id;
    }

    // replace the array of objs
    Vec_PtrFree( pNtk->vObjs );
    pNtk->vObjs = vObjsNew;

    // rehash the AIG
    Abc_AigRehash( (Abc_Aig_t *)pNtk->pManFunc );

    // update the name manager!!!
}